

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_InsertValue_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_InsertValue_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *expected_predicate_value;
  char *actual_predicate_value;
  char *expression_text;
  AssertionResult *assertion_result;
  AssertHelper *this_00;
  AssertHelper *this_01;
  char *pcVar2;
  reference __x;
  bool *lhs;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  long in_RDI;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_3;
  pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  insert_it;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8a8;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8b0;
  bool *in_stack_fffffffffffff8b8;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8c0;
  char *in_stack_fffffffffffff8c8;
  int line;
  char *in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  Type type;
  AssertHelper *in_stack_fffffffffffff8e0;
  char *in_stack_fffffffffffff910;
  char *in_stack_fffffffffffff918;
  char *in_stack_fffffffffffff920;
  AssertionResult *in_stack_fffffffffffff928;
  AssertHelper *in_stack_fffffffffffff930;
  string local_6b0 [52];
  value_type local_67c;
  undefined1 local_671;
  AssertionResult local_670 [2];
  undefined1 local_649;
  AssertionResult local_648;
  value_type local_638;
  value_type *in_stack_fffffffffffff9e8;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9f0;
  string local_5d8 [52];
  value_type local_5a4;
  undefined1 local_599;
  AssertionResult local_598 [2];
  undefined1 local_571;
  AssertionResult local_570;
  value_type local_560;
  key_type local_494;
  size_type local_490;
  undefined4 local_484;
  AssertionResult local_480 [2];
  key_type local_45c;
  size_type local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  size_type local_428;
  undefined4 local_41c;
  AssertionResult local_418 [6];
  value_type local_3b0;
  value_type local_350;
  value_type local_2f0;
  value_type local_290;
  value_type local_230;
  value_type local_1d0;
  value_type local_170;
  value_type local_110;
  string local_108 [55];
  byte local_d1;
  AssertionResult local_d0 [6];
  value_type local_68;
  string local_60 [71];
  undefined1 local_19;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
  local_19 = google::
             BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe072d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8b0,(bool *)in_stack_fffffffffffff8a8,
             (type *)0xe072fa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               in_stack_fffffffffffff910);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8e0,type,in_stack_fffffffffffff8d0,
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)in_stack_fffffffffffff8c0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff930,(Message *)in_stack_fffffffffffff928);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0xe073bb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe07452);
  local_68 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xe074a9);
  local_d1 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8b0,(bool *)in_stack_fffffffffffff8a8,
             (type *)0xe074cd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               in_stack_fffffffffffff910);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8e0,type,in_stack_fffffffffffff8d0,
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)in_stack_fffffffffffff8c0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff930,(Message *)in_stack_fffffffffffff928);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    std::__cxx11::string::~string(local_108);
    testing::Message::~Message((Message *)0xe075a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe07637);
  local_110 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  local_170 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  expected_predicate_value = (char *)(in_RDI + 0x10);
  local_1d0 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  actual_predicate_value = (char *)(in_RDI + 0x10);
  local_230 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  expression_text = (char *)(in_RDI + 0x10);
  local_290 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  local_2f0 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_350 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  local_3b0 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  local_41c = 9;
  local_428 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe07865);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
             (uint *)in_stack_fffffffffffff8b8,(unsigned_long *)in_stack_fffffffffffff8b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8e0);
    testing::AssertionResult::failure_message((AssertionResult *)0xe078de);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8e0,type,in_stack_fffffffffffff8d0,
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)in_stack_fffffffffffff8c0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    testing::Message::~Message((Message *)0xe0793b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe079ac);
  local_44c = 1;
  local_45c = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20))
  ;
  local_458 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff8b0,(key_type *)in_stack_fffffffffffff8a8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
             (uint *)in_stack_fffffffffffff8b8,(unsigned_long *)in_stack_fffffffffffff8b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8e0);
    testing::AssertionResult::failure_message((AssertionResult *)0xe07a67);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8e0,type,in_stack_fffffffffffff8d0,
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)in_stack_fffffffffffff8c0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    testing::Message::~Message((Message *)0xe07ac4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe07b35);
  local_484 = 1;
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_494 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20))
  ;
  local_490 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff8b0,(key_type *)in_stack_fffffffffffff8a8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,
             (uint *)in_stack_fffffffffffff8b8,(unsigned_long *)in_stack_fffffffffffff8b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xe07bf0);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,in_stack_fffffffffffff8d0,
               (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)in_stack_fffffffffffff8c0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    testing::Message::~Message((Message *)0xe07c4d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe07cbe);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool,_true>
            ((pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)in_stack_fffffffffffff8b0);
  pcVar2 = (char *)(in_RDI + 0x10);
  local_560 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
               *)in_stack_fffffffffffff8b0,(type)in_stack_fffffffffffff8a8);
  local_571 = 0;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_stack_fffffffffffff8c8,(char *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
             (bool *)in_stack_fffffffffffff8b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_570);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff8c8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe07d9d);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar2,(int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),
               (char *)in_stack_fffffffffffff8c0);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    testing::Message::~Message((Message *)0xe07dfa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe07e6b);
  __x = google::
        sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)0xe07e78);
  local_5a4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  local_599 = std::operator==(__x,&local_5a4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8b0,(bool *)in_stack_fffffffffffff8a8,
             (type *)0xe07ecb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar2,(int)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)__x);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    std::__cxx11::string::~string(local_5d8);
    testing::Message::~Message((Message *)0xe07f9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe08035);
  lhs = (bool *)(in_RDI + 0x10);
  local_638 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
               *)in_stack_fffffffffffff8b0,(type)in_stack_fffffffffffff8a8);
  local_649 = 1;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_stack_fffffffffffff8c8,(char *)__x,lhs,(bool *)in_stack_fffffffffffff8b0);
  line = (int)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_648);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff8b0 =
         (BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xe08107);
    testing::internal::AssertHelper::AssertHelper(this_01,type,pcVar2,line,(char *)__x);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    testing::Message::~Message((Message *)0xe08164);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe081d5);
  this_02 = (HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)google::
               sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)0xe081e2);
  local_67c = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(this_02,0);
  local_671 = std::operator==((pair<const_int,_int> *)this_02,&local_67c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8b0,(bool *)this_02,(type *)0xe08233);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_670);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,pcVar2,line,(char *)__x);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8b0);
    std::__cxx11::string::~string(local_6b0);
    testing::Message::~Message((Message *)0xe08306);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe08394);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, InsertValue) {
  // First, try some straightforward insertions.
  EXPECT_TRUE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1111)));

  // Check the return type.
  pair<typename TypeParam::iterator, bool> insert_it;
  insert_it = this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(false, insert_it.second);  // false: already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(1));

  insert_it = this->ht_.insert(this->UniqueObject(2));
  EXPECT_EQ(true, insert_it.second);  // true: not already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(2));
}